

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<_FcPattern_*>::appendInitialize
          (QArrayDataPointer<_FcPattern_*> *this,qsizetype newSize)

{
  _FcPattern **pp_Var1;
  _FcPattern *in_RSI;
  _FcPattern **in_RDI;
  _FcPattern **e;
  _FcPattern **b;
  
  begin((QArrayDataPointer<_FcPattern_*> *)0xa7ff90);
  pp_Var1 = begin((QArrayDataPointer<_FcPattern_*> *)0xa7ffa9);
  std::uninitialized_value_construct<_FcPattern**>(pp_Var1 + (long)in_RSI,in_RDI);
  in_RDI[2] = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }